

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::SubRoutineLocNonDecimal::Run(SubRoutineLocNonDecimal *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st0;
  SubroutineUniform local_180;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,2);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubroutineUniform::SubroutineUniform
            (&local_180,generator,&functions_st0,(Loc)ZEXT812(0x20000000a),0,(DefOccurence)0x2,true)
  ;
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,&local_180);
  SubroutineUniform::~SubroutineUniform(&local_180);
  SubroutineUniform::SubroutineUniform
            (&local_180,generator,&functions_st0,(Loc)ZEXT812(0x100000008),0,(DefOccurence)0x2,true)
  ;
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,&local_180);
  SubroutineUniform::~SubroutineUniform(&local_180);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector(&subroutineUniforms);
  SubroutineFunctionSet::~SubroutineFunctionSet(&functions_st0);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//one shader:
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 0x0a) subroutine uniform st0 u0;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(0x0a, Loc::Hex), 0,
													   DefOccurence::FSH_OR_CSH));
		//layout(location = 010 ) subroutine uniform st0 u1;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(010, Loc::Oct), 0,
													   DefOccurence::FSH_OR_CSH));
		return doRun(subroutineUniforms);
	}